

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O3

void divsufsortxx::tandemrepeat::
     introsort<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>>,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long>
               (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                *stack,iterator ISA,iterator ISAd,iterator SA,iterator first,iterator last,
               long *budget,int *chance,long size)

{
  undefined8 *puVar1;
  iterator first1;
  iterator first1_00;
  iterator first2;
  iterator last_00;
  iterator last_01;
  Bitmap *pBVar2;
  pos_type pVar3;
  bool bVar4;
  int iVar5;
  BitmapArray<long> *pBVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  int extraout_var_19;
  undefined4 extraout_var_20;
  int extraout_var_21;
  undefined4 extraout_var_22;
  int extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  _Elt_pointer psVar7;
  int extraout_var_33;
  undefined4 extraout_var_34;
  int extraout_var_35;
  undefined4 extraout_var_36;
  int extraout_var_37;
  undefined4 extraout_var_38;
  ulong uVar8;
  BitmapArray<long> *pBVar9;
  int iVar10;
  long *plVar12;
  pos_type pVar13;
  long lVar14;
  ulong uVar15;
  BitmapArray<long> *pBVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  BitmapArray<long> *pBVar20;
  undefined1 *puVar21;
  BitmapArray<long> *pBVar22;
  deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
  *pdVar23;
  iterator Td;
  iterator Td_00;
  iterator Td_01;
  iterator ISAd_00;
  iterator Td_02;
  iterator first_00;
  iterator first_01;
  iterator SA_00;
  iterator last_02;
  iterator first2_00;
  iterator last_03;
  iterator b;
  iterator local_f8;
  BitmapArray<long> *local_e8;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
  local_e0;
  iterator local_a8;
  BitmapArray<long> *local_98;
  BitmapArray<long> *local_90;
  pos_type local_88;
  deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
  *local_80;
  BitmapArray<long> *local_78;
  BitmapArray<long> *local_70;
  BitmapArray<long> *local_68;
  long *local_60;
  BitmapArray<long> *local_58;
  ulong local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  pos_type pVar11;
  
  local_98 = ISAd.array_;
  local_88 = ISA.pos_;
  pBVar6 = ISA.array_;
  local_f8 = (iterator)ZEXT816(0);
  local_a8.array_ = (BitmapArray<long> *)0x0;
  local_a8.pos_ = 0;
  uVar8 = last.pos_ - first.pos_;
  iVar19 = 0;
  if (0xff < (long)uVar8) {
    iVar19 = 0;
    uVar15 = uVar8;
    do {
      iVar19 = iVar19 + 8;
      uVar8 = uVar15 >> 8;
      bVar4 = 0xffff < uVar15;
      uVar15 = uVar8;
    } while (bVar4);
  }
  pBVar22 = (BitmapArray<long> *)ISAd.pos_;
  local_80 = (deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
              *)stack;
  local_60 = budget;
  local_58 = pBVar6;
  iVar19 = iVar19 + (&helper::log2table)[uVar8];
LAB_0010bbc8:
  do {
    pBVar16 = local_98;
    if (-1 < iVar19) {
      pBVar9 = (BitmapArray<long> *)CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
      pBVar20 = (BitmapArray<long> *)first.pos_;
      do {
        lVar18 = (long)pBVar9 - (long)pBVar20;
        if (lVar18 < 9) {
          if (lVar18 < 2) {
            psVar7 = *(_Elt_pointer *)((long)stack + 0x30);
            if (psVar7 == *(_Elt_pointer *)((long)stack + 0x10)) {
              return;
            }
            goto LAB_0010cf28;
          }
          last_03.array_._4_4_ = last.array_._4_4_;
          last_03.array_._0_4_ = last.array_._0_4_;
          ISAd_00.pos_ = (pos_type)pBVar22;
          ISAd_00.array_ = pBVar16;
          first_01.pos_ = (pos_type)pBVar20;
          first_01.array_ = first.array_;
          last_03.pos_ = (pos_type)pBVar9;
          helper::
          insertionsort<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                    (ISAd_00,first_01,last_03);
          iVar19 = -3;
          goto LAB_0010bbc8;
        }
        local_90 = pBVar22;
        if (iVar19 == 0) {
          Td_02.pos_ = (pos_type)pBVar22;
          Td_02.array_ = pBVar16;
          SA_00.pos_ = (pos_type)pBVar20;
          SA_00.array_ = first.array_;
          helper::heapsort<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                    (Td_02,SA_00,lVar18);
          local_f8.pos_ = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_) - 1;
          local_f8.array_ = (BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_);
          iVar19 = (*(((BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_))->
                     super_Bitmap)._vptr_Bitmap[5])();
          iVar19 = (*(pBVar16->super_Bitmap)._vptr_Bitmap[5])
                             (pBVar16,(long)&(pBVar22->super_Bitmap)._vptr_Bitmap +
                                      CONCAT44(extraout_var_14,iVar19));
          lVar18 = CONCAT44(extraout_var_15,iVar19);
          while (first.pos_ < local_f8.pos_) {
            local_f8.pos_ = local_f8.pos_ - 1;
            iVar19 = (*((local_f8.array_)->super_Bitmap)._vptr_Bitmap[5])();
            iVar19 = (*(pBVar16->super_Bitmap)._vptr_Bitmap[5])
                               (pBVar16,(long)&(local_90->super_Bitmap)._vptr_Bitmap +
                                        CONCAT44(extraout_var_16,iVar19));
            lVar14 = CONCAT44(extraout_var_17,iVar19);
            if (CONCAT44(extraout_var_17,iVar19) == lVar18) {
              iVar19 = (*((local_f8.array_)->super_Bitmap)._vptr_Bitmap[5])
                                 (local_f8.array_,local_f8.pos_);
              (*((local_f8.array_)->super_Bitmap)._vptr_Bitmap[4])
                        (local_f8.array_,local_f8.pos_,~CONCAT44(extraout_var_18,iVar19));
              lVar14 = lVar18;
            }
            lVar18 = lVar14;
          }
          goto LAB_0010c9eb;
        }
        local_e8 = (BitmapArray<long> *)CONCAT44(local_e8._4_4_,iVar19);
        last_02.array_._4_4_ = last.array_._4_4_;
        last_02.array_._0_4_ = last.array_._0_4_;
        Td.pos_ = (pos_type)pBVar22;
        Td.array_ = pBVar16;
        first_00.pos_ = (pos_type)pBVar20;
        first_00.array_ = first.array_;
        last_02.pos_ = (pos_type)pBVar9;
        local_f8 = helper::
                   pivot<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                             (Td,first_00,last_02);
        pVar11 = local_f8.pos_;
        pBVar6 = local_f8.array_;
        iVar19 = (*((first.array_)->super_Bitmap)._vptr_Bitmap[5])(first.array_,first.pos_);
        iVar5 = (*(pBVar6->super_Bitmap)._vptr_Bitmap[5])(pBVar6,pVar11);
        pBVar22 = local_90;
        (*((first.array_)->super_Bitmap)._vptr_Bitmap[4])
                  (first.array_,first.pos_,CONCAT44(extraout_var_00,iVar5));
        (*(pBVar6->super_Bitmap)._vptr_Bitmap[4])(pBVar6,pVar11,CONCAT44(extraout_var,iVar19));
        first1.pos_ = first.pos_;
        first1.array_ = first.array_;
        local_48 = last.array_._0_4_;
        uStack_44 = last.array_._4_4_;
        uStack_40 = (undefined4)last.pos_;
        uStack_3c = last.pos_._4_4_;
        iVar19 = (*((first.array_)->super_Bitmap)._vptr_Bitmap[5])(first.array_,first.pos_);
        iVar19 = (*(pBVar16->super_Bitmap)._vptr_Bitmap[5])
                           (pBVar16,(long)&(pBVar22->super_Bitmap)._vptr_Bitmap +
                                    CONCAT44(extraout_var_01,iVar19));
        local_e0.m_a.array_ = (BitmapArray<long> *)CONCAT44(extraout_var_02,iVar19);
        last_00.array_._4_4_ = uStack_44;
        last_00.array_._0_4_ = local_48;
        last_00.pos_._4_4_ = uStack_3c;
        last_00.pos_._0_4_ = uStack_40;
        Td_00.pos_ = (pos_type)pBVar22;
        Td_00.array_ = pBVar16;
        first2_00.pos_ = first.pos_ + 1;
        first2_00.array_ = first.array_;
        bVar4 = helper::
                partition<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                          (Td_00,first1,first2_00,last_00,&local_f8,&local_a8,
                           (value_type *)&local_e0);
        if (bVar4) {
          iVar19 = (*((local_f8.array_)->super_Bitmap)._vptr_Bitmap[5])
                             (local_f8.array_,local_f8.pos_);
          lVar18 = CONCAT44(extraout_var_03,iVar19) + local_88;
          iVar19 = (*((local_f8.array_)->super_Bitmap)._vptr_Bitmap[5])
                             (local_f8.array_,local_f8.pos_);
          pBVar6 = local_58;
          iVar5 = (*(local_58->super_Bitmap)._vptr_Bitmap[5])(local_58,lVar18);
          iVar19 = (*(pBVar16->super_Bitmap)._vptr_Bitmap[5])
                             (pBVar16,(long)&(pBVar22->super_Bitmap)._vptr_Bitmap +
                                      CONCAT44(extraout_var_04,iVar19));
          pVar11 = local_88;
          iVar10 = -1;
          if (CONCAT44(extraout_var_05,iVar5) != CONCAT44(extraout_var_06,iVar19)) {
            uVar8 = local_a8.pos_ - local_f8.pos_;
            iVar10 = 0;
            if (0xff < (long)uVar8) {
              iVar10 = 0;
              uVar15 = uVar8;
              do {
                iVar10 = iVar10 + 8;
                uVar8 = uVar15 >> 8;
                bVar4 = 0xffff < uVar15;
                uVar15 = uVar8;
              } while (bVar4);
            }
            iVar10 = iVar10 + (&helper::log2table)[uVar8];
          }
          local_78 = (BitmapArray<long> *)CONCAT44(local_78._4_4_,iVar10);
          local_50 = ~SA.pos_;
          local_70 = (BitmapArray<long> *)first.pos_;
          pBVar22 = (BitmapArray<long> *)local_f8.pos_;
          if (first.pos_ < local_f8.pos_) {
            lVar18 = (long)&((Bitmap *)local_f8.pos_)->_vptr_Bitmap + local_50;
            pBVar16 = (BitmapArray<long> *)first.pos_;
            do {
              iVar19 = (*((first.array_)->super_Bitmap)._vptr_Bitmap[5])(first.array_,pBVar16);
              (*(pBVar6->super_Bitmap)._vptr_Bitmap[4])
                        (pBVar6,CONCAT44(extraout_var_11,iVar19) + pVar11,lVar18);
              pBVar16 = (BitmapArray<long> *)((long)&(pBVar16->super_Bitmap)._vptr_Bitmap + 1);
              pBVar22 = (BitmapArray<long> *)local_f8.pos_;
            } while (pBVar16 < local_f8.pos_);
          }
          pVar11 = local_88;
          local_68 = (BitmapArray<long> *)CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
          if ((local_a8.pos_ < local_68) && (pBVar22 < local_a8.pos_)) {
            pBVar16 = local_f8.array_;
            lVar18 = (long)&((Bitmap *)local_a8.pos_)->_vptr_Bitmap + local_50;
            do {
              iVar19 = (*(pBVar16->super_Bitmap)._vptr_Bitmap[5])(pBVar16,pBVar22);
              (*(pBVar6->super_Bitmap)._vptr_Bitmap[4])
                        (pBVar6,CONCAT44(extraout_var_12,iVar19) + pVar11,lVar18);
              pBVar22 = (BitmapArray<long> *)((long)&(pBVar22->super_Bitmap)._vptr_Bitmap + 1);
            } while (pBVar22 < local_a8.pos_);
          }
          pBVar9 = local_68;
          pBVar20 = local_70;
          stack = (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                   *)local_80;
          pBVar22 = local_90;
          pBVar16 = local_98;
          lVar18 = (long)local_70 + (*local_60 - (long)local_68);
          *local_60 = lVar18;
          if (lVar18 < 1) {
            *local_60 = lVar18 + size;
            *chance = *chance + -1;
            if (*chance == 0) goto LAB_0010d457;
          }
          iVar19 = (int)local_e8 + -1;
          lVar18 = local_f8.pos_ - (long)local_70;
          lVar17 = (long)local_68 - local_a8.pos_;
          lVar14 = local_a8.pos_ - local_f8.pos_;
          local_e0.m_d = iVar19;
          if (lVar17 < lVar18) {
            if (lVar14 < lVar18) {
              if (lVar14 < lVar17) {
                local_e0.m_c.array_ = local_f8.array_;
                local_e0.m_c.pos_ = local_f8.pos_;
                local_e0.m_a.array_ = local_98;
                local_e0.m_a.pos_ = (pos_type)local_90;
                local_e0.m_b.array_ = first.array_;
                local_e0.m_b.pos_ = (pos_type)local_70;
                plVar12 = *(long **)(local_80 + 0x30);
                if (plVar12 == (long *)(*(long *)(local_80 + 0x40) + -0x38)) {
                  std::
                  deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                  ::
                  _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                            (local_80,&local_e0);
                  plVar12 = *(long **)((long)stack + 0x30);
                }
                else {
                  plVar12[6] = CONCAT44(local_e0._52_4_,iVar19);
                  plVar12[4] = (long)local_f8.array_;
                  plVar12[5] = local_f8.pos_;
                  plVar12[2] = (long)first.array_;
                  plVar12[3] = (long)local_70;
                  *plVar12 = (long)local_98;
                  plVar12[1] = (long)local_90;
                  plVar12 = (long *)(*(long *)(local_80 + 0x30) + 0x38);
                  *(long **)(local_80 + 0x30) = plVar12;
                }
                local_e0.m_c.array_ =
                     (BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_);
                local_e0.m_c.pos_ = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
                local_e0.m_a.array_ = local_98;
                local_e0.m_a.pos_ = (pos_type)pBVar22;
                local_e0.m_b.array_ = local_a8.array_;
                local_e0.m_b.pos_ = local_a8.pos_;
                if (plVar12 == (long *)(*(long *)((long)stack + 0x40) + -0x38)) {
                  local_e0.m_d = iVar19;
                  std::
                  deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                  ::
                  _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                            ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                              *)stack,&local_e0);
                }
                else {
                  plVar12[6] = CONCAT44(local_e0._52_4_,iVar19);
                  plVar12[4] = (long)local_e0.m_c.array_;
                  plVar12[5] = local_e0.m_c.pos_;
                  plVar12[2] = (long)local_a8.array_;
                  plVar12[3] = local_a8.pos_;
                  *plVar12 = (long)local_98;
                  plVar12[1] = (long)pBVar22;
                  *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x30) + 0x38;
                  local_e0.m_d = iVar19;
                }
                pBVar22 = (BitmapArray<long> *)((long)&(pBVar22->super_Bitmap)._vptr_Bitmap + 1);
                first.array_ = local_f8.array_;
                first.pos_ = local_f8.pos_;
                last.array_._0_4_ = SUB84(local_a8.array_,0);
                last.array_._4_4_ = (undefined4)((ulong)local_a8.array_ >> 0x20);
                last.pos_._0_4_ = (undefined4)local_a8.pos_;
                last.pos_._4_4_ = (undefined4)(local_a8.pos_ >> 0x20);
                pBVar16 = local_98;
                pBVar9 = (BitmapArray<long> *)local_a8.pos_;
                pBVar20 = (BitmapArray<long> *)local_f8.pos_;
                iVar19 = (int)local_78;
              }
              else {
                local_e0.m_c.array_ = local_f8.array_;
                local_e0.m_c.pos_ = local_f8.pos_;
                local_e0.m_a.array_ = local_98;
                local_e0.m_a.pos_ = (pos_type)local_90;
                local_e0.m_b.array_ = first.array_;
                local_e0.m_b.pos_ = (pos_type)local_70;
                plVar12 = *(long **)(local_80 + 0x30);
                if (plVar12 == (long *)(*(long *)(local_80 + 0x40) + -0x38)) {
                  std::
                  deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                  ::
                  _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                            (local_80,&local_e0);
                  plVar12 = *(long **)((long)stack + 0x30);
                }
                else {
                  plVar12[6] = CONCAT44(local_e0._52_4_,iVar19);
                  plVar12[4] = (long)local_f8.array_;
                  plVar12[5] = local_f8.pos_;
                  plVar12[2] = (long)first.array_;
                  plVar12[3] = (long)local_70;
                  *plVar12 = (long)local_98;
                  plVar12[1] = (long)local_90;
                  plVar12 = (long *)(*(long *)(local_80 + 0x30) + 0x38);
                  *(long **)(local_80 + 0x30) = plVar12;
                }
                local_e0.m_a.pos_ = (long)&(pBVar22->super_Bitmap)._vptr_Bitmap + 1;
                local_e0.m_c.array_ = local_a8.array_;
                local_e0.m_c.pos_ = local_a8.pos_;
                local_e0.m_a.array_ = local_98;
                local_e0.m_b.array_ = local_f8.array_;
                local_e0.m_d = (int)local_78;
                local_e0.m_b.pos_ = local_f8.pos_;
                if (plVar12 == (long *)(*(long *)((long)stack + 0x40) + -0x38)) {
                  local_e8 = (BitmapArray<long> *)CONCAT44(local_e8._4_4_,iVar19);
                  std::
                  deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                  ::
                  _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                            ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                              *)stack,&local_e0);
                  iVar19 = (int)local_e8;
                }
                else {
                  plVar12[6] = CONCAT44(local_e0._52_4_,(int)local_78);
                  plVar12[4] = (long)local_a8.array_;
                  plVar12[5] = local_a8.pos_;
                  plVar12[2] = (long)local_f8.array_;
                  plVar12[3] = local_f8.pos_;
                  *plVar12 = (long)local_98;
                  plVar12[1] = local_e0.m_a.pos_;
                  *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x30) + 0x38;
                }
                first.array_ = local_a8.array_;
                first.pos_ = local_a8.pos_;
                pBVar16 = local_98;
                pBVar20 = (BitmapArray<long> *)local_a8.pos_;
              }
            }
            else {
              local_e0.m_a.pos_ = (long)&(local_90->super_Bitmap)._vptr_Bitmap + 1;
              local_e0.m_c.array_ = local_a8.array_;
              local_e0.m_c.pos_ = local_a8.pos_;
              local_e0.m_a.array_ = local_98;
              local_e0.m_b.array_ = local_f8.array_;
              local_e0.m_b.pos_ = local_f8.pos_;
              local_e0.m_d = (int)local_78;
              plVar12 = *(long **)(local_80 + 0x30);
              if (plVar12 == (long *)(*(long *)(local_80 + 0x40) + -0x38)) {
                local_e8 = (BitmapArray<long> *)CONCAT44(local_e8._4_4_,iVar19);
                std::
                deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                ::
                _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                          (local_80,&local_e0);
                plVar12 = *(long **)(local_80 + 0x30);
                local_e0.m_d = (int)local_e8;
              }
              else {
                plVar12[6] = CONCAT44(local_e0._52_4_,(int)local_78);
                plVar12[4] = (long)local_a8.array_;
                plVar12[5] = local_a8.pos_;
                plVar12[2] = (long)local_f8.array_;
                plVar12[3] = local_f8.pos_;
                *plVar12 = (long)local_98;
                plVar12[1] = local_e0.m_a.pos_;
                plVar12 = (long *)(*(long *)(local_80 + 0x30) + 0x38);
                *(long **)(local_80 + 0x30) = plVar12;
                local_e0.m_d = iVar19;
              }
              pBVar9 = local_68;
              stack = (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                       *)local_80;
              local_e0.m_c.array_ = local_f8.array_;
              local_e0.m_c.pos_ = local_f8.pos_;
              local_e0.m_a.array_ = pBVar16;
              local_e0.m_a.pos_ = (pos_type)pBVar22;
              local_e0.m_b.array_ = first.array_;
              local_e0.m_b.pos_ = (pos_type)pBVar20;
              if (plVar12 == (long *)(*(long *)(local_80 + 0x40) + -0x38)) {
                local_e8 = (BitmapArray<long> *)CONCAT44(local_e8._4_4_,local_e0.m_d);
                std::
                deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                ::
                _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                          (local_80,&local_e0);
                iVar19 = (int)local_e8;
              }
              else {
                plVar12[6] = CONCAT44(local_e0._52_4_,local_e0.m_d);
                plVar12[4] = (long)local_f8.array_;
                plVar12[5] = local_f8.pos_;
                plVar12[2] = (long)first.array_;
                plVar12[3] = (long)pBVar20;
                *plVar12 = (long)pBVar16;
                plVar12[1] = (long)pBVar22;
                *(long *)(local_80 + 0x30) = *(long *)(local_80 + 0x30) + 0x38;
                iVar19 = local_e0.m_d;
              }
              first.array_ = local_a8.array_;
              first.pos_ = local_a8.pos_;
              pBVar20 = (BitmapArray<long> *)local_a8.pos_;
            }
          }
          else if (lVar14 < lVar17) {
            if (lVar14 < lVar18) {
              local_e0.m_c.array_ =
                   (BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_);
              local_e0.m_c.pos_ = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
              local_e0.m_a.array_ = local_98;
              local_e0.m_a.pos_ = (pos_type)local_90;
              local_e0.m_b.array_ = local_a8.array_;
              local_e0.m_b.pos_ = local_a8.pos_;
              plVar12 = *(long **)(local_80 + 0x30);
              if (plVar12 == (long *)(*(long *)(local_80 + 0x40) + -0x38)) {
                local_e8 = (BitmapArray<long> *)CONCAT44(local_e8._4_4_,iVar19);
                std::
                deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                ::
                _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                          (local_80,&local_e0);
                plVar12 = *(long **)((long)stack + 0x30);
                local_e0.m_d = (int)local_e8;
              }
              else {
                plVar12[6] = CONCAT44(local_e0._52_4_,iVar19);
                plVar12[4] = (long)local_e0.m_c.array_;
                plVar12[5] = local_e0.m_c.pos_;
                plVar12[2] = (long)local_a8.array_;
                plVar12[3] = local_a8.pos_;
                *plVar12 = (long)local_98;
                plVar12[1] = (long)local_90;
                plVar12 = (long *)(*(long *)(local_80 + 0x30) + 0x38);
                *(long **)(local_80 + 0x30) = plVar12;
              }
              local_e0.m_c.array_ = local_f8.array_;
              local_e0.m_c.pos_ = local_f8.pos_;
              local_e0.m_a.array_ = pBVar16;
              local_e0.m_a.pos_ = (pos_type)pBVar22;
              local_e0.m_b.array_ = first.array_;
              local_e0.m_b.pos_ = (pos_type)local_70;
              if (plVar12 == (long *)(*(long *)((long)stack + 0x40) + -0x38)) {
                std::
                deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                ::
                _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                          ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                            *)stack,&local_e0);
              }
              else {
                plVar12[6] = CONCAT44(local_e0._52_4_,local_e0.m_d);
                plVar12[4] = (long)local_f8.array_;
                plVar12[5] = local_f8.pos_;
                plVar12[2] = (long)first.array_;
                plVar12[3] = (long)local_70;
                *plVar12 = (long)pBVar16;
                plVar12[1] = (long)pBVar22;
                *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x30) + 0x38;
              }
              pBVar22 = (BitmapArray<long> *)((long)&(pBVar22->super_Bitmap)._vptr_Bitmap + 1);
              first.array_ = local_f8.array_;
              first.pos_ = local_f8.pos_;
              last.array_._0_4_ = SUB84(local_a8.array_,0);
              last.array_._4_4_ = (undefined4)((ulong)local_a8.array_ >> 0x20);
              last.pos_._0_4_ = (undefined4)local_a8.pos_;
              last.pos_._4_4_ = (undefined4)(local_a8.pos_ >> 0x20);
              pBVar9 = (BitmapArray<long> *)local_a8.pos_;
              pBVar20 = (BitmapArray<long> *)local_f8.pos_;
              iVar19 = (int)local_78;
            }
            else {
              local_e0.m_c.array_ =
                   (BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_);
              local_e0.m_c.pos_ = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
              local_e0.m_a.array_ = local_98;
              local_e0.m_a.pos_ = (pos_type)local_90;
              local_e0.m_b.array_ = local_a8.array_;
              local_e0.m_b.pos_ = local_a8.pos_;
              plVar12 = *(long **)(local_80 + 0x30);
              if (plVar12 == (long *)(*(long *)(local_80 + 0x40) + -0x38)) {
                local_e8 = (BitmapArray<long> *)CONCAT44(local_e8._4_4_,iVar19);
                std::
                deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                ::
                _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                          (local_80,&local_e0);
                plVar12 = *(long **)((long)stack + 0x30);
                iVar19 = (int)local_e8;
              }
              else {
                plVar12[6] = CONCAT44(local_e0._52_4_,iVar19);
                plVar12[4] = (long)local_e0.m_c.array_;
                plVar12[5] = local_e0.m_c.pos_;
                plVar12[2] = (long)local_a8.array_;
                plVar12[3] = local_a8.pos_;
                *plVar12 = (long)local_98;
                plVar12[1] = (long)local_90;
                plVar12 = (long *)(*(long *)(local_80 + 0x30) + 0x38);
                *(long **)(local_80 + 0x30) = plVar12;
              }
              local_e0.m_a.pos_ = (long)&(pBVar22->super_Bitmap)._vptr_Bitmap + 1;
              local_e0.m_c.array_ = local_a8.array_;
              local_e0.m_c.pos_ = local_a8.pos_;
              local_e0.m_a.array_ = pBVar16;
              local_e0.m_b.array_ = local_f8.array_;
              local_e0.m_d = (int)local_78;
              local_e0.m_b.pos_ = local_f8.pos_;
              if (plVar12 == (long *)(*(long *)((long)stack + 0x40) + -0x38)) {
                local_e8 = (BitmapArray<long> *)CONCAT44(local_e8._4_4_,iVar19);
                std::
                deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                ::
                _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                          ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                            *)stack,&local_e0);
                pBVar9 = (BitmapArray<long> *)local_f8.pos_;
                iVar19 = (int)local_e8;
              }
              else {
                plVar12[6] = CONCAT44(local_e0._52_4_,(int)local_78);
                plVar12[4] = (long)local_a8.array_;
                plVar12[5] = local_a8.pos_;
                plVar12[2] = (long)local_f8.array_;
                plVar12[3] = local_f8.pos_;
                *plVar12 = (long)pBVar16;
                plVar12[1] = local_e0.m_a.pos_;
                *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x30) + 0x38;
                pBVar9 = (BitmapArray<long> *)local_f8.pos_;
              }
              last.array_._0_4_ = SUB84(local_f8.array_,0);
              last.array_._4_4_ = (undefined4)((ulong)local_f8.array_ >> 0x20);
              last.pos_._0_4_ = SUB84(pBVar9,0);
              last.pos_._4_4_ = (undefined4)((ulong)pBVar9 >> 0x20);
            }
          }
          else {
            local_e0.m_a.pos_ = (long)&(local_90->super_Bitmap)._vptr_Bitmap + 1;
            local_e0.m_c.array_ = local_a8.array_;
            local_e0.m_c.pos_ = local_a8.pos_;
            local_e0.m_a.array_ = local_98;
            local_e0.m_b.array_ = local_f8.array_;
            local_e0.m_b.pos_ = local_f8.pos_;
            local_e0.m_d = (int)local_78;
            plVar12 = *(long **)(local_80 + 0x30);
            if (plVar12 == (long *)(*(long *)(local_80 + 0x40) + -0x38)) {
              local_e8 = (BitmapArray<long> *)CONCAT44(local_e8._4_4_,iVar19);
              std::
              deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
              ::
              _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                        (local_80,&local_e0);
              plVar12 = *(long **)((long)stack + 0x30);
              local_e0.m_d = (int)local_e8;
            }
            else {
              plVar12[6] = CONCAT44(local_e0._52_4_,(int)local_78);
              plVar12[4] = (long)local_a8.array_;
              plVar12[5] = local_a8.pos_;
              plVar12[2] = (long)local_f8.array_;
              plVar12[3] = local_f8.pos_;
              *plVar12 = (long)local_98;
              plVar12[1] = local_e0.m_a.pos_;
              plVar12 = (long *)(*(long *)(local_80 + 0x30) + 0x38);
              *(long **)(local_80 + 0x30) = plVar12;
              local_e0.m_d = iVar19;
            }
            local_e0.m_c.array_ = (BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_)
            ;
            local_e0.m_c.pos_ = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
            local_e0.m_a.array_ = pBVar16;
            local_e0.m_a.pos_ = (pos_type)pBVar22;
            local_e0.m_b.array_ = local_a8.array_;
            local_e0.m_b.pos_ = local_a8.pos_;
            if (plVar12 == (long *)(*(long *)((long)stack + 0x40) + -0x38)) {
              local_e8 = (BitmapArray<long> *)CONCAT44(local_e8._4_4_,local_e0.m_d);
              std::
              deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
              ::
              _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                        ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                          *)stack,&local_e0);
              iVar19 = (int)local_e8;
            }
            else {
              plVar12[6] = CONCAT44(local_e0._52_4_,local_e0.m_d);
              plVar12[4] = (long)local_e0.m_c.array_;
              plVar12[5] = local_e0.m_c.pos_;
              plVar12[2] = (long)local_a8.array_;
              plVar12[3] = local_a8.pos_;
              *plVar12 = (long)pBVar16;
              plVar12[1] = (long)pBVar22;
              *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x30) + 0x38;
              iVar19 = local_e0.m_d;
            }
            last.array_._0_4_ = local_f8.array_._0_4_;
            last.array_._4_4_ = local_f8.array_._4_4_;
            last.pos_._0_4_ = (undefined4)local_f8.pos_;
            last.pos_._4_4_ = local_f8.pos_._4_4_;
            pBVar9 = (BitmapArray<long> *)local_f8.pos_;
          }
        }
        else {
          iVar19 = (*((first.array_)->super_Bitmap)._vptr_Bitmap[5])(first.array_,first.pos_);
          lVar18 = CONCAT44(extraout_var_07,iVar19) + local_88;
          iVar19 = (*((first.array_)->super_Bitmap)._vptr_Bitmap[5])(first.array_,first.pos_);
          pBVar6 = local_58;
          iVar5 = (*(local_58->super_Bitmap)._vptr_Bitmap[5])(local_58,lVar18);
          iVar10 = (*(pBVar16->super_Bitmap)._vptr_Bitmap[5])
                             (pBVar16,(long)&(pBVar22->super_Bitmap)._vptr_Bitmap +
                                      CONCAT44(extraout_var_08,iVar19));
          iVar19 = (int)local_e8;
          if (CONCAT44(extraout_var_09,iVar5) == CONCAT44(extraout_var_10,iVar10)) {
            iVar19 = -1;
          }
          pBVar22 = (BitmapArray<long> *)((long)&(pBVar22->super_Bitmap)._vptr_Bitmap + 1);
          pBVar9 = (BitmapArray<long> *)CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
          lVar18 = (first.pos_ - (long)pBVar9) + *local_60;
          *local_60 = lVar18;
          pBVar16 = local_98;
          pBVar20 = (BitmapArray<long> *)first.pos_;
          stack = (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                   *)local_80;
          if (0 < lVar18) goto LAB_0010c80a;
          *local_60 = lVar18 + size;
          *chance = *chance + -1;
          pBVar20 = (BitmapArray<long> *)first.pos_;
          if (*chance == 0) goto LAB_0010d457;
        }
LAB_0010c80a:
      } while (-1 < iVar19);
    }
    if (iVar19 == -2) {
      psVar7 = *(_Elt_pointer *)((long)stack + 0x30);
      if (psVar7 == *(_Elt_pointer *)((long)stack + 0x38)) {
        psVar7 = (*(_Map_pointer *)((long)stack + 0x48))[-1] + 9;
      }
      pBVar16 = psVar7[-1].m_b.array_;
      local_e8 = (BitmapArray<long> *)psVar7[-1].m_b.pos_;
      pBVar9 = psVar7[-1].m_c.array_;
      pBVar20 = (BitmapArray<long> *)psVar7[-1].m_c.pos_;
      std::
      deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
      ::pop_back(&stack->c);
      local_f8.pos_ = (pos_type)local_e8;
      local_f8.array_ = pBVar16;
      pBVar22 = (BitmapArray<long> *)((long)pBVar22 - local_88);
      local_68 = (BitmapArray<long> *)SA.pos_;
      local_98 = (BitmapArray<long> *)((long)&(pBVar20->super_Bitmap)._vptr_Bitmap + ~SA.pos_);
      local_a8.array_ = pBVar9;
      local_a8.pos_ = (pos_type)pBVar20;
      local_90 = pBVar22;
      local_78 = pBVar16;
      local_70 = pBVar9;
      if (first.pos_ < local_e8) {
        do {
          iVar19 = (*((first.array_)->super_Bitmap)._vptr_Bitmap[5])(first.array_,first.pos_);
          lVar18 = CONCAT44(extraout_var_29,iVar19) - (long)pBVar22;
          if (-1 < lVar18) {
            lVar14 = local_88 + lVar18;
            iVar19 = (*(pBVar6->super_Bitmap)._vptr_Bitmap[5])(pBVar6,lVar14);
            pBVar16 = local_e8;
            pBVar22 = local_90;
            if ((BitmapArray<long> *)CONCAT44(extraout_var_30,iVar19) == local_98) {
              (*(pBVar6->super_Bitmap)._vptr_Bitmap[4])
                        (pBVar6,lVar14,(long)local_e8 - (long)local_68);
              (*(local_78->super_Bitmap)._vptr_Bitmap[4])(local_78,pBVar16,lVar18);
              pBVar22 = local_90;
              local_e8 = (BitmapArray<long> *)((long)&(pBVar16->super_Bitmap)._vptr_Bitmap + 1);
            }
          }
          first.pos_ = (long)&(((BitmapArray<long> *)first.pos_)->super_Bitmap)._vptr_Bitmap + 1;
        } while (first.pos_ < local_e8);
      }
      local_70 = local_a8.array_;
      if (local_e8 < local_a8.pos_) {
        lVar18 = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
        pBVar16 = (BitmapArray<long> *)local_a8.pos_;
        do {
          lVar18 = lVar18 + -1;
          lVar14 = (**(code **)(*(long *)CONCAT44(last.array_._4_4_,last.array_._0_4_) + 0x28))
                             ((long *)CONCAT44(last.array_._4_4_,last.array_._0_4_),lVar18);
          lVar14 = lVar14 - (long)pBVar22;
          if (-1 < lVar14) {
            lVar17 = local_88 + lVar14;
            iVar19 = (*(pBVar6->super_Bitmap)._vptr_Bitmap[5])(pBVar6,lVar17);
            pBVar22 = local_90;
            if ((BitmapArray<long> *)CONCAT44(extraout_var_31,iVar19) == local_98) {
              pBVar16 = (BitmapArray<long> *)&pBVar16[-1].field_0x27;
              (*(local_70->super_Bitmap)._vptr_Bitmap[4])(local_70,pBVar16,lVar14);
              (*(pBVar6->super_Bitmap)._vptr_Bitmap[4])
                        (pBVar6,lVar17,(long)pBVar16 - (long)local_68);
              pBVar22 = local_90;
            }
          }
        } while (local_e8 < pBVar16);
      }
      psVar7 = *(_Elt_pointer *)(local_80 + 0x30);
      stack = (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
               *)local_80;
      if (psVar7 == *(_Elt_pointer *)(local_80 + 0x10)) {
        return;
      }
LAB_0010cf28:
      if (psVar7 == *(_Elt_pointer *)((long)stack + 0x38)) {
        psVar7 = (*(_Map_pointer *)((long)stack + 0x48))[-1] + 9;
      }
      local_98 = psVar7[-1].m_a.array_;
      pBVar22 = (BitmapArray<long> *)psVar7[-1].m_a.pos_;
      first.array_ = psVar7[-1].m_b.array_;
      first.pos_ = psVar7[-1].m_b.pos_;
      pBVar16 = psVar7[-1].m_c.array_;
      pVar11 = psVar7[-1].m_c.pos_;
      local_e8 = (BitmapArray<long> *)CONCAT44(local_e8._4_4_,psVar7[-1].m_d);
      last.array_._0_4_ = SUB84(pBVar16,0);
      last.array_._4_4_ = (undefined4)((ulong)pBVar16 >> 0x20);
      last.pos_._0_4_ = (undefined4)pVar11;
      last.pos_._4_4_ = (undefined4)(pVar11 >> 0x20);
      std::
      deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
      ::pop_back(&stack->c);
      iVar19 = (int)local_e8;
      goto LAB_0010bbc8;
    }
    local_90 = pBVar22;
    if (iVar19 != -1) {
LAB_0010c9eb:
      (*((first.array_)->super_Bitmap)._vptr_Bitmap[5])(first.array_,first.pos_);
      uVar8 = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
      if (-1 < extraout_var_19) {
        local_f8.pos_ = first.pos_;
        local_f8.array_ = first.array_;
        do {
          lVar18 = local_f8.pos_ - SA.pos_;
          iVar19 = (*((local_f8.array_)->super_Bitmap)._vptr_Bitmap[5])();
          (*(pBVar6->super_Bitmap)._vptr_Bitmap[4])
                    (pBVar6,CONCAT44(extraout_var_20,iVar19) + local_88,lVar18);
          first.pos_ = local_f8.pos_ + 1;
          local_f8.pos_ = first.pos_;
          if (uVar8 <= first.pos_) goto LAB_0010ca7f;
          (*((local_f8.array_)->super_Bitmap)._vptr_Bitmap[5])(local_f8.array_,first.pos_);
        } while (-1 < extraout_var_21);
        first.pos_ = local_f8.pos_;
LAB_0010ca7f:
        first.array_ = local_f8.array_;
      }
      pBVar22 = first.array_;
      pVar11 = first.pos_;
      if (uVar8 <= first.pos_) {
        psVar7 = *(_Elt_pointer *)((long)stack + 0x30);
        if (psVar7 == *(_Elt_pointer *)((long)stack + 0x10)) {
          return;
        }
        goto LAB_0010cf28;
      }
      do {
        local_f8.pos_ = pVar11;
        local_f8.array_ = pBVar22;
        iVar19 = (*((local_f8.array_)->super_Bitmap)._vptr_Bitmap[5])(local_f8.array_,local_f8.pos_)
        ;
        (*((local_f8.array_)->super_Bitmap)._vptr_Bitmap[4])
                  (local_f8.array_,local_f8.pos_,~CONCAT44(extraout_var_22,iVar19));
        local_f8.pos_ = local_f8.pos_ + 1;
        (*((local_f8.array_)->super_Bitmap)._vptr_Bitmap[5])();
        pVar3 = local_88;
        pVar11 = local_f8.pos_;
        pBVar22 = local_f8.array_;
      } while (extraout_var_23 < 0);
      local_f8.pos_ = local_f8.pos_ + 1;
      if ((local_f8.pos_ < uVar8) && (first.pos_ < local_f8.pos_)) {
        pVar13 = first.pos_;
        do {
          iVar19 = (*((first.array_)->super_Bitmap)._vptr_Bitmap[5])(first.array_,pVar13);
          (*(pBVar6->super_Bitmap)._vptr_Bitmap[4])
                    (pBVar6,CONCAT44(extraout_var_24,iVar19) + pVar3,pVar11 - SA.pos_);
          pVar13 = pVar13 + 1;
        } while (pVar13 < local_f8.pos_);
      }
      iVar19 = (*((first.array_)->super_Bitmap)._vptr_Bitmap[5])(first.array_,first.pos_);
      iVar5 = (*((first.array_)->super_Bitmap)._vptr_Bitmap[5])(first.array_,first.pos_);
      pBVar2 = &local_90->super_Bitmap;
      iVar10 = (*(pBVar6->super_Bitmap)._vptr_Bitmap[5])
                         (pBVar6,CONCAT44(extraout_var_25,iVar19) + pVar3);
      pBVar16 = local_98;
      iVar5 = (*(local_98->super_Bitmap)._vptr_Bitmap[5])
                        (local_98,(long)&pBVar2->_vptr_Bitmap + CONCAT44(extraout_var_26,iVar5));
      stack = (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
               *)local_80;
      pBVar22 = local_90;
      iVar19 = -1;
      if (CONCAT44(extraout_var_27,iVar10) != CONCAT44(extraout_var_28,iVar5)) {
        uVar8 = local_f8.pos_ - first.pos_;
        iVar19 = 0;
        if (0xff < (long)uVar8) {
          iVar19 = 0;
          uVar15 = uVar8;
          do {
            iVar19 = iVar19 + 8;
            uVar8 = uVar15 >> 8;
            bVar4 = 0xffff < uVar15;
            uVar15 = uVar8;
          } while (bVar4);
        }
        iVar19 = iVar19 + (&helper::log2table)[uVar8];
      }
      pBVar9 = (BitmapArray<long> *)CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
      lVar18 = (first.pos_ - (long)pBVar9) + *local_60;
      *local_60 = lVar18;
      if (lVar18 < 1) {
        *local_60 = lVar18 + size;
        *chance = *chance + -1;
        if (*chance == 0) {
LAB_0010d457:
          psVar7 = *(_Elt_pointer *)(local_80 + 0x30);
          pVar11 = local_88;
          pdVar23 = local_80;
          if (psVar7 != *(_Elt_pointer *)(local_80 + 0x10)) {
            do {
              if (psVar7 == *(_Elt_pointer *)(pdVar23 + 0x38)) {
                psVar7 = (*(_Map_pointer *)(local_80 + 0x48))[-1] + 9;
              }
              if (psVar7[-1].m_d == -3) {
                pBVar22 = (BitmapArray<long> *)psVar7[-1].m_c.pos_;
                pBVar16 = (BitmapArray<long> *)psVar7[-1].m_b.pos_;
                local_f8.array_ = psVar7[-1].m_b.array_;
                while( true ) {
                  local_f8.pos_ = (pos_type)pBVar16;
                  if (pBVar22 <= pBVar16) break;
                  (*((local_f8.array_)->super_Bitmap)._vptr_Bitmap[5])();
                  pBVar16 = (BitmapArray<long> *)local_f8.pos_;
                  if (-1 < extraout_var_33) {
                    local_a8.array_ = local_f8.array_;
                    local_a8.pos_ = local_f8.pos_;
                    do {
                      lVar18 = local_f8.pos_ - SA.pos_;
                      iVar19 = (*((local_f8.array_)->super_Bitmap)._vptr_Bitmap[5])();
                      (*(pBVar6->super_Bitmap)._vptr_Bitmap[4])
                                (pBVar6,CONCAT44(extraout_var_34,iVar19) + local_88,lVar18);
                      pBVar16 = (BitmapArray<long> *)(local_f8.pos_ + 1);
                      local_f8.pos_ = (pos_type)pBVar16;
                      if (pBVar22 <= pBVar16) goto LAB_0010d543;
                      (*((local_f8.array_)->super_Bitmap)._vptr_Bitmap[5])();
                    } while (-1 < extraout_var_35);
                    pBVar16 = (BitmapArray<long> *)local_f8.pos_;
LAB_0010d543:
                    pVar11 = local_88;
                    if (pBVar22 <= pBVar16) break;
                  }
                  local_a8.array_ = local_f8.array_;
                  local_a8.pos_ = (pos_type)pBVar16;
                  do {
                    iVar19 = (*((local_f8.array_)->super_Bitmap)._vptr_Bitmap[5])
                                       (local_f8.array_,local_f8.pos_);
                    (*((local_f8.array_)->super_Bitmap)._vptr_Bitmap[4])
                              (local_f8.array_,local_f8.pos_,~CONCAT44(extraout_var_36,iVar19));
                    local_f8.pos_ = local_f8.pos_ + 1;
                    (*((local_f8.array_)->super_Bitmap)._vptr_Bitmap[5])();
                  } while (extraout_var_37 < 0);
                  lVar18 = local_f8.pos_ - SA.pos_;
                  do {
                    iVar19 = (*((local_a8.array_)->super_Bitmap)._vptr_Bitmap[5])
                                       (local_a8.array_,local_a8.pos_);
                    (*(pBVar6->super_Bitmap)._vptr_Bitmap[4])
                              (pBVar6,CONCAT44(extraout_var_38,iVar19) + pVar11,lVar18);
                    local_a8.pos_ = (long)&((Bitmap *)local_a8.pos_)->_vptr_Bitmap + 1;
                  } while (local_a8.pos_ <= local_f8.pos_);
                  pBVar16 = (BitmapArray<long> *)
                            ((long)&((Bitmap *)local_f8.pos_)->_vptr_Bitmap + 1);
                }
              }
              pdVar23 = local_80;
              std::
              deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
              ::pop_back((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
                          *)local_80);
              psVar7 = *(_Elt_pointer *)(pdVar23 + 0x30);
            } while (psVar7 != *(_Elt_pointer *)(pdVar23 + 0x10));
          }
          return;
        }
      }
      if ((long)((long)pBVar9 - local_f8.pos_) < (long)(local_f8.pos_ - first.pos_)) {
        if (pBVar9 <= local_f8.pos_) {
LAB_0010d449:
          pBVar22 = (BitmapArray<long> *)((long)&(pBVar22->super_Bitmap)._vptr_Bitmap + 1);
          last.array_._0_4_ = SUB84(local_f8.array_,0);
          last.array_._4_4_ = (undefined4)((ulong)local_f8.array_ >> 0x20);
          last.pos_._0_4_ = (undefined4)local_f8.pos_;
          last.pos_._4_4_ = (undefined4)(local_f8.pos_ >> 0x20);
          goto LAB_0010bbc8;
        }
        local_e0.m_a.pos_ = (long)&(local_90->super_Bitmap)._vptr_Bitmap + 1;
        local_e0.m_c.array_ = local_f8.array_;
        local_e0.m_c.pos_ = local_f8.pos_;
        local_e0.m_a.array_ = pBVar16;
        local_e0.m_b.array_ = first.array_;
        local_e0.m_b.pos_ = first.pos_;
        puVar1 = *(undefined8 **)(local_80 + 0x30);
        local_e0.m_d = iVar19;
        if (puVar1 == (undefined8 *)(*(long *)(local_80 + 0x40) + -0x38)) {
          std::
          deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
          ::
          _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                    (local_80,&local_e0);
        }
        else {
          puVar1[6] = CONCAT44(local_e0._52_4_,iVar19);
          puVar1[4] = local_f8.array_;
          puVar1[5] = local_f8.pos_;
          puVar1[2] = first.array_;
          puVar1[3] = first.pos_;
          *puVar1 = pBVar16;
          puVar1[1] = local_e0.m_a.pos_;
          *(long *)(local_80 + 0x30) = *(long *)(local_80 + 0x30) + 0x38;
        }
      }
      else if (first.pos_ < local_f8.pos_) {
        local_e0.m_c.array_ = (BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_);
        local_e0.m_c.pos_ = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
        local_e0.m_a.array_ = pBVar16;
        local_e0.m_a.pos_ = (pos_type)local_90;
        local_e0.m_b.array_ = local_f8.array_;
        local_e0.m_b.pos_ = local_f8.pos_;
        local_e0.m_d = -3;
        puVar1 = *(undefined8 **)(local_80 + 0x30);
        if (puVar1 == (undefined8 *)(*(long *)(local_80 + 0x40) + -0x38)) {
          std::
          deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
          ::
          _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                    (local_80,&local_e0);
        }
        else {
          puVar1[6] = CONCAT44(local_e0._52_4_,0xfffffffd);
          puVar1[4] = local_e0.m_c.array_;
          puVar1[5] = local_e0.m_c.pos_;
          puVar1[2] = local_f8.array_;
          puVar1[3] = local_f8.pos_;
          *puVar1 = pBVar16;
          puVar1[1] = local_90;
          *(long *)(local_80 + 0x30) = *(long *)(local_80 + 0x30) + 0x38;
        }
        goto LAB_0010d449;
      }
      first.array_ = local_f8.array_;
      first.pos_ = local_f8.pos_;
      iVar19 = -3;
      goto LAB_0010bbc8;
    }
    puVar21 = &pBVar22[-1].field_0x27;
    first2.pos_ = first.pos_;
    first2.array_ = first.array_;
    first1_00.pos_ = first.pos_;
    first1_00.array_ = first.array_;
    local_e0.m_a.array_ =
         (BitmapArray<long> *)(~SA.pos_ + CONCAT44(last.pos_._4_4_,(undefined4)last.pos_));
    last_01.array_._4_4_ = last.array_._4_4_;
    last_01.array_._0_4_ = last.array_._0_4_;
    last_01.pos_._4_4_ = last.pos_._4_4_;
    last_01.pos_._0_4_ = (undefined4)last.pos_;
    Td_01.pos_ = (pos_type)puVar21;
    Td_01.array_ = pBVar16;
    helper::partition<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
              (Td_01,first1_00,first2,last_01,&local_f8,&local_a8,(value_type *)&local_e0);
    pBVar22 = (BitmapArray<long> *)CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
    pBVar16 = (BitmapArray<long> *)local_f8.pos_;
    local_e8 = (BitmapArray<long> *)puVar21;
    if ((local_f8.pos_ < pBVar22) && (first.pos_ < local_f8.pos_)) {
      pBVar2 = (Bitmap *)local_f8.pos_;
      pBVar9 = (BitmapArray<long> *)first.pos_;
      do {
        iVar19 = (*((first.array_)->super_Bitmap)._vptr_Bitmap[5])(first.array_,pBVar9);
        (*(pBVar6->super_Bitmap)._vptr_Bitmap[4])
                  (pBVar6,CONCAT44(extraout_var_13,iVar19) + local_88,
                   (long)&pBVar2->_vptr_Bitmap + ~SA.pos_);
        pBVar9 = (BitmapArray<long> *)((long)&(pBVar9->super_Bitmap)._vptr_Bitmap + 1);
        pBVar16 = (BitmapArray<long> *)local_f8.pos_;
      } while (pBVar9 < local_f8.pos_);
    }
    pVar11 = local_88;
    pBVar9 = local_f8.array_;
    if ((local_a8.pos_ < pBVar22) && (pBVar16 < local_a8.pos_)) {
      pBVar2 = (Bitmap *)local_a8.pos_;
      do {
        iVar19 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,pBVar16);
        (*(pBVar6->super_Bitmap)._vptr_Bitmap[4])
                  (pBVar6,CONCAT44(extraout_var_32,iVar19) + pVar11,
                   (long)&pBVar2->_vptr_Bitmap + ~SA.pos_);
        pBVar16 = (BitmapArray<long> *)((long)&(pBVar16->super_Bitmap)._vptr_Bitmap + 1);
      } while (pBVar16 < local_a8.pos_);
      pBVar16 = (BitmapArray<long> *)local_f8.pos_;
    }
    stack = (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
             *)local_80;
    local_e0.m_c.array_ = local_a8.array_;
    local_e0.m_c.pos_ = local_a8.pos_;
    local_e0.m_a.array_ = local_98;
    local_e0.m_a.pos_ = (pos_type)local_90;
    local_e0.m_d = 0;
    plVar12 = *(long **)(local_80 + 0x30);
    if (plVar12 == (long *)(*(long *)(local_80 + 0x40) + -0x38)) {
      local_e0.m_b.array_ = local_f8.array_;
      local_e0.m_b.pos_ = (pos_type)pBVar16;
      std::
      deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
      ::
      _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                (local_80,&local_e0);
      plVar12 = *(long **)((long)stack + 0x30);
    }
    else {
      plVar12[6] = (ulong)(uint)local_e0._52_4_ << 0x20;
      plVar12[4] = (long)local_a8.array_;
      plVar12[5] = local_a8.pos_;
      plVar12[2] = (long)local_f8.array_;
      plVar12[3] = (long)pBVar16;
      *plVar12 = (long)local_98;
      plVar12[1] = (long)local_90;
      plVar12 = (long *)(*(long *)(local_80 + 0x30) + 0x38);
      *(long **)(local_80 + 0x30) = plVar12;
    }
    local_e0.m_c.array_ = (BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_);
    local_e0.m_c.pos_ = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
    local_e0.m_a.array_ = local_98;
    local_e0.m_a.pos_ = (pos_type)local_e8;
    local_e0.m_b.array_ = first.array_;
    local_e0.m_b.pos_ = first.pos_;
    local_e0.m_d = -2;
    if (plVar12 == (long *)(*(long *)((long)stack + 0x40) + -0x38)) {
      std::
      deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
      ::
      _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                  *)stack,&local_e0);
    }
    else {
      plVar12[6] = CONCAT44(local_e0._52_4_,0xfffffffe);
      plVar12[4] = (long)local_e0.m_c.array_;
      plVar12[5] = local_e0.m_c.pos_;
      plVar12[2] = (long)first.array_;
      plVar12[3] = first.pos_;
      *plVar12 = (long)local_98;
      plVar12[1] = (long)local_e8;
      *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x30) + 0x38;
    }
    uVar8 = local_f8.pos_ - first.pos_;
    uVar15 = (long)pBVar22 - local_a8.pos_;
    if ((long)uVar15 < (long)uVar8) {
      pBVar16 = (BitmapArray<long> *)local_f8.pos_;
      if (local_a8.pos_ < pBVar22) {
        local_e0.m_d = 0;
        if (0xff < (long)uVar8) {
          local_e0.m_d = 0;
          uVar15 = uVar8;
          do {
            local_e0.m_d = local_e0.m_d + 8;
            uVar8 = uVar15 >> 8;
            bVar4 = 0xffff < uVar15;
            uVar15 = uVar8;
          } while (bVar4);
        }
        local_e0.m_d = local_e0.m_d + (&helper::log2table)[uVar8];
        local_e0.m_c.array_ = local_f8.array_;
        local_e0.m_c.pos_ = local_f8.pos_;
        local_e0.m_a.array_ = local_98;
        local_e0.m_a.pos_ = (pos_type)local_90;
        local_e0.m_b.array_ = first.array_;
        local_e0.m_b.pos_ = first.pos_;
        plVar12 = *(long **)((long)stack + 0x30);
        if (plVar12 == (long *)(*(long *)((long)stack + 0x40) + -0x38)) {
          std::
          deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
          ::
          _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                    ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                      *)stack,&local_e0);
        }
        else {
          plVar12[6] = CONCAT44(local_e0._52_4_,local_e0.m_d);
          plVar12[4] = (long)local_f8.array_;
          plVar12[5] = local_f8.pos_;
          plVar12[2] = (long)first.array_;
          plVar12[3] = first.pos_;
          *plVar12 = (long)local_98;
          plVar12[1] = (long)local_90;
          *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x30) + 0x38;
        }
        first.array_ = local_a8.array_;
        first.pos_ = local_a8.pos_;
      }
      else {
LAB_0010d3a5:
        last.array_._0_4_ = SUB84(local_f8.array_,0);
        last.array_._4_4_ = (undefined4)((ulong)local_f8.array_ >> 0x20);
        last.pos_._0_4_ = SUB84(pBVar16,0);
        last.pos_._4_4_ = (undefined4)((ulong)pBVar16 >> 0x20);
        pBVar22 = pBVar16;
      }
    }
    else {
      if (first.pos_ < local_f8.pos_) {
        local_e0.m_d = 0;
        if (0xff < (long)uVar15) {
          local_e0.m_d = 0;
          uVar8 = uVar15;
          do {
            local_e0.m_d = local_e0.m_d + 8;
            uVar15 = uVar8 >> 8;
            bVar4 = 0xffff < uVar8;
            uVar8 = uVar15;
          } while (bVar4);
        }
        local_e0.m_d = local_e0.m_d + (&helper::log2table)[uVar15];
        local_e0.m_c.array_ = (BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_);
        local_e0.m_c.pos_ = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
        local_e0.m_a.array_ = local_98;
        local_e0.m_a.pos_ = (pos_type)local_90;
        local_e0.m_b.array_ = local_a8.array_;
        local_e0.m_b.pos_ = local_a8.pos_;
        plVar12 = *(long **)((long)stack + 0x30);
        if (plVar12 == (long *)(*(long *)((long)stack + 0x40) + -0x38)) {
          std::
          deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
          ::
          _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                    ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                      *)stack,&local_e0);
        }
        else {
          plVar12[6] = CONCAT44(local_e0._52_4_,local_e0.m_d);
          plVar12[4] = (long)local_e0.m_c.array_;
          plVar12[5] = local_e0.m_c.pos_;
          plVar12[2] = (long)local_a8.array_;
          plVar12[3] = local_a8.pos_;
          *plVar12 = (long)local_98;
          plVar12[1] = (long)local_90;
          *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x30) + 0x38;
        }
        pBVar16 = (BitmapArray<long> *)local_f8.pos_;
        goto LAB_0010d3a5;
      }
      first.array_ = local_a8.array_;
      first.pos_ = local_a8.pos_;
    }
    uVar8 = (long)pBVar22 - first.pos_;
    iVar19 = 0;
    if (0xff < (long)uVar8) {
      iVar19 = 0;
      uVar15 = uVar8;
      do {
        iVar19 = iVar19 + 8;
        uVar8 = uVar15 >> 8;
        bVar4 = 0xffff < uVar15;
        uVar15 = uVar8;
      } while (bVar4);
    }
    pBVar22 = local_90;
    iVar19 = iVar19 + (&helper::log2table)[uVar8];
  } while( true );
}

Assistant:

void introsort(stack_type &stack, ISAIterator_type ISA, ISAIterator_type ISAd,
               const SAIterator_type SA, SAIterator_type first,
               SAIterator_type last, pos_type &budget, int &chance,
               pos_type size) {
  typedef typename std::iterator_traits<ISAIterator_type>::value_type value_type;
  typedef typename stack_type::value_type stackinfo_type;
#define UPDATE_BUDGET(n)\
  {\
    budget -= (n);\
    if(budget <= 0) {\
      budget += size;\
      if(--chance == 0) { break; }\
    }\
  }

  SAIterator_type a, b, c, d, e;
  pos_type s, t;
  value_type v, x;
  int limit, next;

  for (limit = helper::lg(last - first);;) {

    if (limit < 0) {
      if (limit == -1) {
        /* tandem repeat partition */
        helper::partition(ISAd - 1, first, first, last, a, b, last - SA - 1);

        /* update ranks */
        if (a < last) {
          for (c = first, v = a - SA - 1; c < a; ++c) {
            ISA[*c] = v;
          }
        }
        if (b < last) {
          for (c = a, v = b - SA - 1; c < b; ++c) {
            ISA[*c] = v;
          }
        }

        /* push */
        STACK_PUSH4(ISAd, a, b, 0);
        STACK_PUSH4(ISAd - 1, first, last, -2);
        if ((a - first) <= (last - b)) {
          if (first < a) {
            STACK_PUSH4(ISAd, b, last, helper::lg(last - b));
            last = a;
          } else {
            first = b;
          }
        } else {
          if (b < last) {
            STACK_PUSH4(ISAd, first, a, helper::lg(a - first));
            first = b;
          } else {
            last = a;
          }
        }
        limit = helper::lg(last - first);
      } else if (limit == -2) {
        /* tandem repeat copy */
        stackinfo_type temp = stack.top();
        stack.pop();
        a = temp.m_b, b = temp.m_c;
        t = ISAd - ISA;
        v = b - SA - 1;
        for (c = first, d = a; c < d; ++c) {
          if ((0 <= (s = *c - t)) && (ISA[s] == v)) {
            ISA[s] = d - SA;
            *d++ = s;
          }
        }
        for (c = last - 1, e = d, d = b; e < d; --c) {
          if ((0 <= (s = *c - t)) && (ISA[s] == v)) {
            *--d = s;
            ISA[s] = d - SA;
          }
        }
        STACK_POP4(ISAd, first, last, limit);
      } else {
        /* sorted partition */
        if (0 <= *first) {
          a = first;
          do {
            ISA[*a] = a - SA;
          } while ((++a < last) && (0 <= *a));
          first = a;
        }
        if (first < last) {
          a = first;
          do {
            *a = ~*a;
          } while (*++a < 0);
          ++a;
          if (a < last) {
            for (c = first, v = a - SA - 1; c < a; ++c) {
              ISA[*c] = v;
            }
          }

          /* push */
          next = (ISA[*first] == ISAd[*first]) ? -1 : helper::lg(a - first);
          UPDATE_BUDGET(last - first);
          if ((a - first) <= (last - a)) {
            if (first < a) {
              STACK_PUSH4(ISAd, a, last, -3);
              ISAd += 1, last = a, limit = next;
            } else {
              first = a, limit = -3;
            }
          } else {
            if (a < last) {
              STACK_PUSH4(ISAd + 1, first, a, next);
              first = a, limit = -3;
            } else {
              ISAd += 1, last = a, limit = next;
            }
          }
        } else {
          STACK_POP4(ISAd, first, last, limit);
        }
      }
      continue;
    }

    if ((last - first) <= 8) {
      if (1 < (last - first)) {
        helper::insertionsort(ISAd, first, last);
        limit = -3;
      } else {
        STACK_POP4(ISAd, first, last, limit);
      }
      continue;
    }

    if (limit-- == 0) {
      helper::heapsort(ISAd, first, last - first);
      for (a = last - 1, v = ISAd[*a]; first < a;) {
        if ((x = ISAd[*--a]) == v) {
          *a = ~*a;
        } else {
          v = x;
        }
      }
      limit = -3;
      continue;
    }

    a = helper::pivot(ISAd, first, last);
    std::iter_swap(first, a);
    if (helper::partition(ISAd, first, first + 1, last, a, b, ISAd[*first])
        != false) {
      next = (ISA[*a] == ISAd[*a]) ? -1 : helper::lg(b - a);

      /* update ranks */
      for (c = first, v = a - SA - 1; c < a; ++c) {
        ISA[*c] = v;
      }
      if (b < last) {
        for (c = a, v = b - SA - 1; c < b; ++c) {
          ISA[*c] = v;
        }
      }

      /* push */
      UPDATE_BUDGET(last - first);
      if ((a - first) <= (last - b)) {
        if ((last - b) <= (b - a)) {
          STACK_PUSH4(ISAd + 1, a, b, next);
          STACK_PUSH4(ISAd, b, last, limit);
          last = a;
        } else if ((a - first) <= (b - a)) {
          STACK_PUSH4(ISAd, b, last, limit);
          STACK_PUSH4(ISAd + 1, a, b, next);
          last = a;
        } else {
          STACK_PUSH4(ISAd, b, last, limit);
          STACK_PUSH4(ISAd, first, a, limit);
          ISAd += 1, first = a, last = b, limit = next;
        }
      } else {
        if ((a - first) <= (b - a)) {
          STACK_PUSH4(ISAd + 1, a, b, next);
          STACK_PUSH4(ISAd, first, a, limit);
          first = b;
        } else if ((last - b) <= (b - a)) {
          STACK_PUSH4(ISAd, first, a, limit);
          STACK_PUSH4(ISAd + 1, a, b, next);
          first = b;
        } else {
          STACK_PUSH4(ISAd, first, a, limit);
          STACK_PUSH4(ISAd, b, last, limit);
          ISAd += 1, first = a, last = b, limit = next;
        }
      }
    } else {
      limit = (ISA[*first] == ISAd[*first]) ? -1 : (limit + 1), ISAd += 1;
      UPDATE_BUDGET(last - first);
    }
  }

  for (; stack.empty() == false; stack.pop()) {
    stackinfo_type temp = stack.top();
    if (temp.m_d == -3) {
      first = temp.m_b, last = temp.m_c;
      for (a = first; a < last; ++a) {
        if (0 <= *a) {
          b = a;
          do {
            ISA[*a] = a - SA;
          } while ((++a < last) && (0 <= *a));
          if (last <= a) {
            break;
          }
        }
        b = a;
        do {
          *a = ~*a;
        } while (*++a < 0);
        v = a - SA;
        do {
          ISA[*b] = v;
        } while (++b <= a);
      }
    }
  }
#undef UPDATE_BUDGET
}